

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void prof_butcher(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  OBJ_DATA *pOVar2;
  OBJ_INDEX_DATA *pObjIndex;
  char *txt;
  CProficiencies *pCVar3;
  CProficiencies *pCVar4;
  int i;
  int iVar5;
  int nummeat;
  
  if (*argument != '\0') {
    pOVar2 = get_obj_here(ch,argument);
    if (pOVar2 != (OBJ_DATA *)0x0) {
      if (pOVar2->item_type == 0x17) {
        if (pOVar2->contains == (OBJ_DATA *)0x0) {
          iVar5 = 0;
          act("$n butchers $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks."
              ,ch,pOVar2,(void *)0x0,0);
          act("You butcher $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks."
              ,ch,pOVar2,(void *)0x0,3);
          extract_obj(pOVar2);
          if (ch->pcdata == (PC_DATA *)0x0) {
            pCVar3 = &prof_none;
          }
          else {
            pCVar3 = &ch->pcdata->profs;
          }
          iVar1 = CProficiencies::GetProf(pCVar3,"butchery");
          iVar1 = (iVar1 + 2) / 3;
          nummeat = 1;
          if (1 < iVar1) {
            nummeat = iVar1;
          }
          act("After the butchering process, you are left with $i pieces of meat.",ch,&nummeat,
              (void *)0x0,3);
          pCVar3 = &prof_none;
          for (; iVar5 < nummeat; iVar5 = iVar5 + 1) {
            pObjIndex = get_obj_index(0x4b);
            pOVar2 = create_object(pObjIndex,(int)ch->level);
            obj_to_char(pOVar2,ch);
            pCVar4 = &ch->pcdata->profs;
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar4 = &prof_none;
            }
            iVar1 = CProficiencies::GetProf(pCVar4,"butchery");
            pOVar2->value[0] = pOVar2->value[0] + iVar1;
            pCVar4 = &ch->pcdata->profs;
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar4 = &prof_none;
            }
            iVar1 = CProficiencies::GetProf(pCVar4,"butchery");
            pOVar2->value[1] = pOVar2->value[1] + iVar1;
            pCVar4 = &ch->pcdata->profs;
            if (ch->pcdata == (PC_DATA *)0x0) {
              pCVar4 = &prof_none;
            }
            iVar1 = CProficiencies::GetProf(pCVar4,"butchery");
            pOVar2->timer = (short)iVar1 * 2 + 0xc;
          }
          if (ch->pcdata != (PC_DATA *)0x0) {
            pCVar3 = &ch->pcdata->profs;
          }
          CProficiencies::CheckImprove(pCVar3,"butchery",100);
          WAIT_STATE(ch,0xc);
          return;
        }
        txt = "That corpse is too full to be gutted.\n\r";
      }
      else {
        txt = "You can\'t butcher that.\n\r";
      }
      goto LAB_003b0f71;
    }
  }
  txt = "You don\'t see that here.\n\r";
LAB_003b0f71:
  send_to_char(txt,ch);
  return;
}

Assistant:

void prof_butcher(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;

	if (argument[0] == '\0' || !(obj = get_obj_here(ch, argument)))
	{
		send_to_char("You don't see that here.\n\r",ch);
		return;
	}

	if (obj->item_type != ITEM_CORPSE_NPC)
	{
		send_to_char("You can't butcher that.\n\r", ch);
		return;
	}

	if (obj->contains)
	{
		send_to_char("That corpse is too full to be gutted.\n\r", ch);
		return;
	}

	act("$n butchers $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_ROOM);
	act("You butcher $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_CHAR);

	extract_obj(obj);

	int nummeat = std::max(1, (ch->Profs()->GetProf("butchery") + 2) / 3);
	act("After the butchering process, you are left with $i pieces of meat.", ch, &nummeat, 0, TO_CHAR);

	for (auto i = 0; i < nummeat; i++)
	{
		auto meat = create_object(get_obj_index(OBJ_VNUM_MEAT_CHUNKS), ch->level);
		obj_to_char(meat, ch);
		meat->value[0] += ch->Profs()->GetProf("butchery");
		meat->value[1] += ch->Profs()->GetProf("butchery");
		meat->timer = 12 + ch->Profs()->GetProf("butchery") * 2;
	}

	ch->Profs()->CheckImprove("butchery", 100);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}